

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O2

void __thiscall
OpenMD::OrderParameterProbZ::OrderParameterProbZ
          (OrderParameterProbZ *this,SimInfo *info,string *filename,string *sele,RealType dipoleX,
          RealType dipoleY,RealType dipoleZ,int nbins,int axis)

{
  SelectionEvaluator *this_00;
  Vector3d *this_01;
  Vector3d *this_02;
  string *psVar1;
  pointer pdVar2;
  pointer pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  SelectionManager *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  string *local_78;
  string *local_70;
  pointer local_68;
  RealType local_60;
  RealType local_58;
  string local_50;
  
  local_70 = filename;
  local_68 = (pointer)dipoleX;
  local_60 = dipoleY;
  local_58 = dipoleZ;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__OrderParameterProbZ_002efd60;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->evaluator_;
  local_78 = &this->selectionScript_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_88 = &this->seleMan_;
  SelectionManager::SelectionManager(local_88,info);
  (this->thermo_).info_ = info;
  this_01 = &this->refAxis_;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vector<double,_3U>::Vector(&this_01->super_Vector<double,_3U>);
  this_02 = &this->dipoleVector_;
  Vector<double,_3U>::Vector(&this_02->super_Vector<double,_3U>);
  local_80 = &this->Count_;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->nbins_ = nbins;
  this->axis_ = axis;
  psVar1 = &this->axisLabel_;
  (this->axisLabel_)._M_dataplus._M_p = (pointer)&(this->axisLabel_).field_2;
  (this->axisLabel_)._M_string_length = 0;
  (this->axisLabel_).field_2._M_local_buf[0] = '\0';
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_a8,this_00);
    SelectionManager::setSelectionSet(local_88,(SelectionSet *)&local_a8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_a8);
  }
  std::vector<double,_std::allocator<double>_>::resize(local_80,(long)nbins);
  pdVar2 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
    *pdVar3 = 0.0;
  }
  if (this->axis_ == 1) {
    std::__cxx11::string::assign((char *)psVar1);
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0x3ff0000000000000;
    local_a8.field_2._M_allocated_capacity = 0;
    Vector<double,_3U>::operator=
              (&this_01->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_a8);
  }
  else if (this->axis_ == 0) {
    std::__cxx11::string::assign((char *)psVar1);
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    Vector<double,_3U>::operator=
              (&this_01->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_a8);
  }
  else {
    std::__cxx11::string::assign((char *)psVar1);
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0x3ff0000000000000;
    Vector<double,_3U>::operator=
              (&this_01->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_a8);
  }
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_a8);
  local_a8._M_dataplus._M_p = local_68;
  local_a8._M_string_length = (size_type)local_60;
  local_a8.field_2._M_allocated_capacity = (size_type)local_58;
  Vector<double,_3U>::operator=(&this_02->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_a8);
  Vector<double,_3U>::normalize(&this_02->super_Vector<double,_3U>);
  getPrefix(&local_50,local_70);
  std::operator+(&local_a8,&local_50,".OrderProb");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

OrderParameterProbZ::OrderParameterProbZ(
      SimInfo* info, const std::string& filename, const std::string& sele,
      const RealType dipoleX, const RealType dipoleY, const RealType dipoleZ,
      int nbins, int axis) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      nbins_(nbins), axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins
    Count_.resize(nbins);
    std::fill(Count_.begin(), Count_.end(), 0);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      refAxis_   = Vector3d(1, 0, 0);
      break;
    case 1:
      axisLabel_ = "y";
      refAxis_   = Vector3d(0, 1, 0);
      break;
    case 2:
    default:
      axisLabel_ = "z";
      refAxis_   = Vector3d(0, 0, 1);
      break;
    }

    dipoleVector_ = Vector3d(dipoleX, dipoleY, dipoleZ);
    dipoleVector_.normalize();

    setOutputName(getPrefix(filename) + ".OrderProb");
  }